

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O3

int XNVCTRLIsNvScreen(Display *dpy,int screen)

{
  int iVar1;
  XExtDisplayInfo *pXVar2;
  undefined1 *puVar3;
  _func_int__XDisplay_ptr *p_Var4;
  xnvCtrlIsNvReply rep;
  undefined1 local_40 [8];
  int local_38;
  
  pXVar2 = find_display(dpy);
  iVar1 = 0;
  if ((pXVar2 != (XExtDisplayInfo *)0x0) && (iVar1 = 0, pXVar2->codes != (XExtCodes *)0x0)) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar3 = (undefined1 *)_XGetRequest(dpy,1,8);
    *puVar3 = (char)pXVar2->codes->major_opcode;
    puVar3[1] = 1;
    *(int *)(puVar3 + 4) = screen;
    iVar1 = _XReply(dpy,local_40,0,1);
    if (iVar1 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      iVar1 = 0;
    }
    else {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      iVar1 = local_38;
    }
    if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
      (*p_Var4)(dpy);
    }
  }
  return iVar1;
}

Assistant:

Bool XNVCTRLIsNvScreen (
    Display *dpy,
    int screen
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlIsNvReply rep;
    xnvCtrlIsNvReq   *req;
    Bool isnv;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlIsNv, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlIsNv;
    req->screen = screen;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    isnv = rep.isnv;
    UnlockDisplay (dpy);
    SyncHandle ();
    return isnv;
}